

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_common.c
# Opt level: O1

apx_typeCode_t apx_vm_variant_to_type_code(uint8_t variant)

{
  if (variant < 0x10) {
    return (&DAT_00148820)[variant];
  }
  return '\0';
}

Assistant:

apx_typeCode_t apx_vm_variant_to_type_code(uint8_t variant)
{
   apx_typeCode_t retval;
   switch (variant)
   {
   case APX_VM_VARIANT_UINT8:
      retval = APX_TYPE_CODE_UINT8;
      break;
   case APX_VM_VARIANT_UINT16:
      retval = APX_TYPE_CODE_UINT16;
      break;
   case APX_VM_VARIANT_UINT32:
      retval = APX_TYPE_CODE_UINT32;
      break;
   case APX_VM_VARIANT_UINT64:
      retval = APX_TYPE_CODE_UINT64;
      break;
   case APX_VM_VARIANT_INT8:
      retval = APX_TYPE_CODE_INT8;
      break;
   case APX_VM_VARIANT_INT16:
      retval = APX_TYPE_CODE_INT16;
      break;
   case APX_VM_VARIANT_INT32:
      retval = APX_TYPE_CODE_INT32;
      break;
   case APX_VM_VARIANT_INT64:
      retval = APX_TYPE_CODE_INT64;
      break;
   case APX_VM_VARIANT_BOOL:
      retval = APX_TYPE_CODE_BOOL;
      break;
   case APX_VM_VARIANT_BYTE:
      retval = APX_TYPE_CODE_BYTE;
      break;
   case APX_VM_VARIANT_RECORD:
      retval = APX_TYPE_CODE_RECORD;
      break;
   case APX_VM_VARIANT_CHAR:
      retval = APX_TYPE_CODE_CHAR;
      break;
   case APX_VM_VARIANT_CHAR8:
      retval = APX_TYPE_CODE_CHAR8;
      break;
   case APX_VM_VARIANT_CHAR16:
      retval = APX_TYPE_CODE_CHAR16;
      break;
   case APX_VM_VARIANT_CHAR32:
      retval = APX_TYPE_CODE_CHAR32;
      break;
   default:
      retval = APX_TYPE_CODE_NONE;
   }
   return retval;
}